

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# socketutils.cpp
# Opt level: O1

bool myutils::check_connect(SOCKET sock,int timeout_second)

{
  int iVar1;
  int iVar2;
  long lVar3;
  long lVar4;
  long lVar5;
  fd_set *__exceptfds;
  SOCKET high_sock;
  timeval *in_R8;
  ulong uVar6;
  byte unaff_R13B;
  bool bVar7;
  int err;
  socklen_t len;
  fd_set wset;
  fd_set rset;
  int local_138;
  undefined1 local_134 [132];
  fd_set local_b0;
  
  lVar3 = std::chrono::_V2::system_clock::now();
  lVar4 = std::chrono::_V2::system_clock::now();
  lVar5 = (long)timeout_second;
  if (SBORROW8(lVar4 - lVar3,lVar5 * 1000000000) != (lVar4 - lVar3) + lVar5 * -1000000000 < 0) {
    iVar1 = sock + 0x3f;
    if (-1 < sock) {
      iVar1 = sock;
    }
    __exceptfds = (fd_set *)(ulong)(uint)(sock % 0x40);
    uVar6 = 1L << ((byte)(sock % 0x40) & 0x3f);
    do {
      iVar2 = select(sock,&local_b0,(fd_set *)(local_134 + 4),__exceptfds,in_R8);
      __exceptfds = (fd_set *)0x2;
      if (1 < iVar2 + 1U) {
        if ((local_b0.fds_bits[iVar1 >> 6] & uVar6) == 0) {
          bVar7 = ((&local_b0)[-1].fds_bits[iVar1 >> 6] & uVar6) != 0;
          __exceptfds = (fd_set *)(ulong)bVar7;
          unaff_R13B = unaff_R13B | bVar7;
        }
        else {
          local_138 = 0;
          local_134._0_4_ = 4;
          in_R8 = (timeval *)local_134;
          iVar2 = getsockopt(sock,1,4,&local_138,(socklen_t *)in_R8);
          if (iVar2 != 0) {
            local_138 = 1;
          }
          unaff_R13B = local_138 == 0;
          __exceptfds = (fd_set *)0x1;
        }
      }
      if (((ulong)__exceptfds & 1) != 0) goto LAB_0013f025;
      lVar4 = std::chrono::_V2::system_clock::now();
    } while (SBORROW8(lVar4 - lVar3,lVar5 * 1000000000) != (lVar4 - lVar3) + lVar5 * -1000000000 < 0
            );
  }
  unaff_R13B = 0;
LAB_0013f025:
  return (bool)(unaff_R13B & 1);
}

Assistant:

bool check_connect(SOCKET sock, int timeout_second) //, fd_set* rset, fd_set* wset)
    {
        auto begin_time = system_clock::now();

        while (system_clock::now() - begin_time < seconds(timeout_second)) {
            SOCKET high_sock = sock;

            fd_set rset, wset;
            int r = select(high_sock, &rset, &wset);
            if (r == -1 || r == 0 || is_EWOURLDBLOCK(r)) {
                continue;
            }
            else if (FD_ISSET(sock, &rset)) {
                int err = 0;
                socklen_t len = sizeof(err);
                int ret = getsockopt(sock, SOL_SOCKET, SO_ERROR, (char *)&err, &len);
                if (ret != 0) err = 1;

                return err == 0;
            }
            else if (FD_ISSET(sock, &wset)) {
                return true;
            }
        }

        return false;
    }